

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjpeghandler.cpp
# Opt level: O0

QVariant * __thiscall QJpegHandler::option(QJpegHandler *this,ImageOption option)

{
  Int IVar1;
  QList<QByteArray> *this_00;
  undefined4 in_EDX;
  long in_RSI;
  QJpegHandlerPrivate *in_RDI;
  long in_FS_OFFSET;
  QByteArrayList list;
  char (*in_stack_ffffffffffffff40) [14];
  QList<QByteArray> *in_stack_ffffffffffffff48;
  QIODevice *in_stack_ffffffffffffff60;
  QIODevice *device;
  QJpegHandlerPrivate *pQVar2;
  QByteArray local_48;
  QRect *local_30;
  undefined8 local_28;
  QRect *local_20;
  undefined8 local_18;
  QSize *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  switch(in_EDX) {
  case 0:
    pQVar2 = in_RDI;
    QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar2,in_stack_ffffffffffffff60);
    QVariant::QVariant((QVariant *)pQVar2,(QVariant *)(*(long *)(in_RSI + 0x10) + 8));
    break;
  case 1:
    local_30 = *(QRect **)(*(long *)(in_RSI + 0x10) + 0x44);
    local_28 = *(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x4c);
    QVariant::QVariant((QVariant *)in_RDI,local_30);
    break;
  case 2:
    device = *(QIODevice **)(in_RSI + 0x10);
    pQVar2 = in_RDI;
    QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar2,device);
    QVariant::QVariant((QVariant *)pQVar2,(QString *)(*(long *)(in_RSI + 0x10) + 0x58));
    break;
  case 3:
    local_20 = *(QRect **)(*(long *)(in_RSI + 0x10) + 0x34);
    local_18 = *(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x3c);
    QVariant::QVariant((QVariant *)in_RDI,local_20);
    break;
  case 4:
    local_10 = *(QSize **)(*(long *)(in_RSI + 0x10) + 0x2c);
    QVariant::QVariant((QVariant *)in_RDI,local_10);
    break;
  default:
    QVariant::QVariant((QVariant *)0x1093c6);
    break;
  case 7:
    QVariant::QVariant((QVariant *)in_RDI,**(int **)(in_RSI + 0x10));
    break;
  case 9:
    pQVar2 = in_RDI;
    QByteArray::QByteArray
              (&local_48,SupportedJPEGSubtypes[*(int *)(*(long *)(in_RSI + 0x10) + 0xa0)],-1);
    QVariant::QVariant((QVariant *)pQVar2,(QByteArray *)&local_48);
    QByteArray::~QByteArray((QByteArray *)0x109289);
    break;
  case 0xe:
    pQVar2 = in_RDI;
    QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar2,in_stack_ffffffffffffff60);
    QVariant::QVariant((QVariant *)pQVar2,*(int *)(*(long *)(in_RSI + 0x10) + 0x28));
    break;
  case 0xf:
    this_00 = (QList<QByteArray> *)const(&SupportedJPEGSubtypes);
    const(&SupportedJPEGSubtypes);
    QList<QByteArray>::QList<const_char_(*)[14],_true>
              (this_00,(char (*) [14])in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    QVariant::fromValue<QList<QByteArray>>(in_stack_ffffffffffffff48);
    QList<QByteArray>::~QList((QList<QByteArray> *)0x1092fa);
    break;
  case 0x10:
    QVariant::QVariant((QVariant *)in_RDI,(bool)(*(byte *)(*(long *)(in_RSI + 0x10) + 0x4bc) & 1));
    break;
  case 0x11:
    QVariant::QVariant((QVariant *)in_RDI,(bool)(*(byte *)(*(long *)(in_RSI + 0x10) + 0x4bd) & 1));
    break;
  case 0x12:
    pQVar2 = in_RDI;
    QImageIOHandler::device();
    QJpegHandlerPrivate::readJpegHeader(pQVar2,in_stack_ffffffffffffff60);
    IVar1 = QFlags::operator_cast_to_unsigned_int((QFlags *)(*(long *)(in_RSI + 0x10) + 4));
    QVariant::QVariant((QVariant *)pQVar2,IVar1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QVariant *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QJpegHandler::option(ImageOption option) const
{
    switch(option) {
    case Quality:
        return d->quality;
    case ScaledSize:
        return d->scaledSize;
    case ScaledClipRect:
        return d->scaledClipRect;
    case ClipRect:
        return d->clipRect;
    case Description:
        d->readJpegHeader(device());
        return d->description;
    case Size:
        d->readJpegHeader(device());
        return d->size;
    case SubType:
        return QByteArray(SupportedJPEGSubtypes[int(d->subType)]);
    case SupportedSubTypes: {
        QByteArrayList list(std::begin(SupportedJPEGSubtypes),
                            std::end(SupportedJPEGSubtypes));
        return QVariant::fromValue(list);
    }
    case ImageFormat:
        d->readJpegHeader(device());
        return d->format;
    case OptimizedWrite:
        return d->optimize;
    case ProgressiveScanWrite:
        return d->progressive;
    case ImageTransformation:
        d->readJpegHeader(device());
        return int(d->transformation);
    default:
        break;
    }

    return QVariant();
}